

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkFromTruthTable(word *pTruth,int nVars)

{
  Mem_Flex_t *pMan_00;
  char *pSop;
  Abc_Ntk_t *pNtk_00;
  char *pSopCover;
  Mem_Flex_t *pMan;
  Abc_Ntk_t *pNtk;
  int nVars_local;
  word *pTruth_local;
  
  pMan_00 = Mem_FlexStart();
  pSop = Abc_SopCreateFromTruth(pMan_00,nVars,(uint *)pTruth);
  pNtk_00 = Abc_NtkCreateWithNode(pSop);
  Abc_NtkShortNames(pNtk_00);
  Mem_FlexStop(pMan_00,0);
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromTruthTable( word * pTruth, int nVars )
{
    Abc_Ntk_t * pNtk;
    Mem_Flex_t * pMan;
    char * pSopCover;

    pMan = Mem_FlexStart();
    pSopCover = Abc_SopCreateFromTruth( pMan, nVars, (unsigned*)pTruth );
    pNtk = Abc_NtkCreateWithNode( pSopCover );
    Abc_NtkShortNames( pNtk );
    Mem_FlexStop( pMan, 0 );

    return pNtk;
}